

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

WitnessSize __thiscall miniscript::Node<unsigned_int>::CalcWitnessSize(Node<unsigned_int> *this)

{
  pointer psVar1;
  bool bVar2;
  pointer pMVar3;
  pointer pMVar4;
  uint uVar5;
  element_type *peVar6;
  MaxInt<unsigned_int> MVar7;
  int iVar8;
  ulong uVar9;
  element_type *peVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  pointer psVar15;
  ulong uVar16;
  long lVar17;
  MaxInt<unsigned_int> MVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  WitnessSize WVar21;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  ret;
  MaxInt<unsigned_int> local_80;
  MaxInt<unsigned_int> local_78;
  pointer pMStack_70;
  pointer local_68;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_script_ctx == TAPSCRIPT) {
    iVar8 = 0x21;
    uVar5 = 0x42;
  }
  else {
    if (this->m_script_ctx != P2WSH) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    iVar8 = 0x22;
    uVar5 = 0x49;
  }
  MVar7.value = 0;
  MVar7._0_4_ = this->fragment;
  MVar18.valid = true;
  MVar18._1_3_ = 0;
  MVar18.value = 0;
  switch(MVar7) {
  case (MaxInt<unsigned_int>)0x0:
    break;
  case (MaxInt<unsigned_int>)0x1:
  case (MaxInt<unsigned_int>)0x4:
  case (MaxInt<unsigned_int>)0x5:
    MVar7.valid = true;
    MVar7._1_3_ = 0;
    MVar7.value = 0;
    goto LAB_00dc9bda;
  case (MaxInt<unsigned_int>)0x2:
    MVar18.valid = true;
    MVar18._1_3_ = 0;
    MVar18.value = 1;
    goto LAB_00dc9b02;
  case (MaxInt<unsigned_int>)0x3:
    MVar7 = (MaxInt<unsigned_int>)(((ulong)(uVar5 + iVar8) << 0x20) + 1);
    MVar18 = (MaxInt<unsigned_int>)(((ulong)(iVar8 + 1) << 0x20) + 1);
    break;
  case (MaxInt<unsigned_int>)0x6:
  case (MaxInt<unsigned_int>)0x7:
  case (MaxInt<unsigned_int>)0x8:
  case (MaxInt<unsigned_int>)0x9:
    MVar7.valid = true;
    MVar7._1_3_ = 0;
    MVar7.value = 0x21;
    goto LAB_00dc9bda;
  case (MaxInt<unsigned_int>)0xa:
  case (MaxInt<unsigned_int>)0xb:
  case (MaxInt<unsigned_int>)0xc:
  case (MaxInt<unsigned_int>)0x10:
    peVar6 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    MVar7 = (peVar6->ws).sat;
    MVar18 = *(MaxInt<unsigned_int> *)((long)&peVar6->ws + 8);
    break;
  case (MaxInt<unsigned_int>)0xd:
    peVar6 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    bVar20 = (peVar6->ws).sat.valid != '\x01';
    if (bVar20) {
      uVar16 = 0;
    }
    else {
      uVar16 = (ulong)(*(uint *)((long)&peVar6->ws + 4) + 2) << 0x20;
    }
    MVar7 = (MaxInt<unsigned_int>)(uVar16 | !bVar20);
    MVar18.valid = true;
    MVar18._1_3_ = 0;
    MVar18.value = 1;
    break;
  case (MaxInt<unsigned_int>)0xe:
    MVar7 = (((((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->ws).sat;
    goto LAB_00dc9bda;
  case (MaxInt<unsigned_int>)0xf:
    MVar18.valid = true;
    MVar18._1_3_ = 0;
    MVar18.value = 1;
    MVar7 = (((((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->ws).sat;
    break;
  case (MaxInt<unsigned_int>)0x11:
    psVar15 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar6 = (psVar15->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (((peVar6->ws).sat.valid == '\x01') &&
       (peVar10 = psVar15[1].
                  super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr, (peVar10->ws).sat.valid == '\x01')) {
      uVar9 = (ulong)(*(uint *)((long)&peVar10->ws + 4) + *(uint *)((long)&peVar6->ws + 4)) << 0x20;
      uVar16 = 1;
    }
    else {
      uVar9 = 0;
      uVar16 = 0;
    }
    MVar7 = (MaxInt<unsigned_int>)(uVar9 | uVar16);
    goto LAB_00dc9bda;
  case (MaxInt<unsigned_int>)0x12:
    psVar15 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar6 = (psVar15->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar15[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (((peVar6->ws).sat.valid == '\x01') && ((peVar10->ws).sat.valid == '\x01')) {
      uVar16 = (ulong)(*(uint *)((long)&peVar10->ws + 4) + *(uint *)((long)&peVar6->ws + 4)) << 0x20
      ;
      uVar9 = 1;
    }
    else {
      uVar16 = 0;
      uVar9 = 0;
    }
    if ((((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid == true) &&
       (((MaxInt<unsigned_int> *)((long)&peVar10->ws + 8))->valid == true)) {
      uVar19 = (ulong)(*(uint *)((long)&peVar10->ws + 0xc) + *(uint *)((long)&peVar6->ws + 0xc)) <<
               0x20;
      uVar13 = 1;
    }
    else {
      uVar19 = 0;
      uVar13 = 0;
    }
    MVar18 = (MaxInt<unsigned_int>)(uVar19 | uVar13);
    MVar7 = (MaxInt<unsigned_int>)(uVar9 | uVar16);
    break;
  case (MaxInt<unsigned_int>)0x13:
    psVar15 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar6 = (psVar15->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar15[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    cVar11 = ((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid;
    uVar5 = 0;
    uVar12 = 0;
    bVar14 = 0;
    if ((cVar11 == '\x01') && (uVar12 = 0, (peVar10->ws).sat.valid == '\x01')) {
      uVar12 = *(uint *)((long)&peVar10->ws + 4) + *(uint *)((long)&peVar6->ws + 0xc);
      bVar14 = 1;
    }
    bVar20 = false;
    if (((peVar6->ws).sat.valid == '\x01') &&
       (uVar5 = 0, ((MaxInt<unsigned_int> *)((long)&peVar10->ws + 8))->valid == true)) {
      uVar5 = *(uint *)((long)&peVar10->ws + 0xc) + *(uint *)((long)&peVar6->ws + 4);
LAB_00dc9aa0:
      bVar20 = true;
    }
    goto LAB_00dc9aa3;
  case (MaxInt<unsigned_int>)0x14:
    psVar15 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar6 = (psVar15->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar16 = 0;
    bVar20 = false;
    if (((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid == true) {
      peVar10 = psVar15[1].
                super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      uVar16 = 0;
      bVar20 = false;
      if ((peVar10->ws).sat.valid == '\x01') {
        uVar16 = (ulong)(*(uint *)((long)&peVar10->ws + 4) + *(uint *)((long)&peVar6->ws + 0xc));
        bVar20 = true;
      }
    }
    if ((peVar6->ws).sat.valid == '\0') {
      uVar13 = (ulong)bVar20;
      uVar9 = uVar13;
    }
    else if (bVar20) {
      uVar5 = *(uint *)((long)&peVar6->ws + 4);
      if ((uint)uVar16 < uVar5) {
        uVar16 = (ulong)uVar5;
      }
      uVar13 = 1;
      uVar9 = 0;
    }
    else {
      uVar9 = *(ulong *)&(peVar6->ws).sat;
      uVar16 = uVar9 >> 0x20;
      uVar13 = uVar9 & 0xff;
    }
    MVar7 = (MaxInt<unsigned_int>)((ulong)((uint)uVar9 & 0xffffff00) | uVar16 << 0x20 | uVar13);
LAB_00dc9bda:
    MVar18.valid = false;
    MVar18._1_3_ = 0;
    MVar18.value = 0;
    break;
  case (MaxInt<unsigned_int>)0x15:
    psVar15 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar6 = (psVar15->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar15[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    cVar11 = ((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid;
    uVar16 = 0;
    bVar20 = false;
    if (cVar11 == '\x01') {
      uVar16 = 0;
      bVar20 = false;
      if ((peVar10->ws).sat.valid == '\x01') {
        uVar16 = (ulong)(*(uint *)((long)&peVar10->ws + 4) + *(uint *)((long)&peVar6->ws + 0xc));
        bVar20 = true;
      }
    }
    if ((peVar6->ws).sat.valid == '\0') {
      uVar9 = (ulong)bVar20;
      uVar13 = uVar9;
    }
    else if (bVar20) {
      uVar5 = *(uint *)((long)&peVar6->ws + 4);
      if ((uint)uVar16 < uVar5) {
        uVar16 = (ulong)uVar5;
      }
      uVar9 = 0;
      uVar13 = 1;
    }
    else {
      uVar9 = *(ulong *)&(peVar6->ws).sat;
      uVar16 = uVar9 >> 0x20;
      uVar13 = uVar9 & 0xff;
    }
    uVar16 = (ulong)((uint)uVar9 & 0xffffff00) | uVar16 << 0x20;
    goto LAB_00dc9c00;
  case (MaxInt<unsigned_int>)0x16:
    psVar15 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar6 = (psVar15->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar16 = (ulong)(peVar6->ws).sat.valid;
    uVar5 = 0;
    uVar12 = 0;
    if (uVar16 == 1) {
      uVar12 = *(uint *)((long)&peVar6->ws + 4) + 2;
    }
    peVar10 = psVar15[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    bVar20 = (peVar10->ws).sat.valid == '\x01';
    if (bVar20) {
      uVar5 = *(uint *)((long)&peVar10->ws + 4) + 1;
    }
    uVar9 = (ulong)bVar20;
    if (uVar16 == 0) {
      uVar13 = (ulong)uVar5 << 0x20;
    }
    else if (bVar20) {
      if (uVar5 < uVar12) {
        uVar5 = uVar12;
      }
      uVar13 = (ulong)uVar5 << 0x20;
      uVar9 = 1;
    }
    else {
      uVar13 = (ulong)uVar12 << 0x20;
      uVar9 = uVar16;
    }
    uVar16 = (ulong)((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid;
    uVar5 = 0;
    uVar12 = 0;
    if (uVar16 == 1) {
      uVar12 = *(uint *)((long)&peVar6->ws + 0xc) + 2;
    }
    bVar20 = ((MaxInt<unsigned_int> *)((long)&peVar10->ws + 8))->valid == true;
    if (bVar20) {
      uVar5 = *(uint *)((long)&peVar10->ws + 0xc) + 1;
    }
    MVar7 = (MaxInt<unsigned_int>)(uVar13 | uVar9);
    if (uVar16 == 0) {
      uVar9 = (ulong)uVar5 << 0x20;
      uVar16 = (ulong)bVar20;
    }
    else if (bVar20) {
      if (uVar5 < uVar12) {
        uVar5 = uVar12;
      }
      uVar9 = (ulong)uVar5 << 0x20;
      uVar16 = 1;
    }
    else {
      uVar9 = (ulong)uVar12 << 0x20;
    }
    MVar18 = (MaxInt<unsigned_int>)(uVar9 | uVar16);
    break;
  case (MaxInt<unsigned_int>)0x17:
    psVar15 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar6 = (psVar15->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar5 = 0;
    uVar12 = 0;
    bVar14 = 0;
    if ((peVar6->ws).sat.valid == '\x01') {
      peVar10 = psVar15[1].
                super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      uVar12 = 0;
      if ((peVar10->ws).sat.valid == '\x01') {
        uVar12 = *(uint *)((long)&peVar10->ws + 4) + *(uint *)((long)&peVar6->ws + 4);
        bVar14 = 1;
      }
    }
    peVar10 = psVar15[2].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    cVar11 = ((MaxInt<unsigned_int> *)((long)&peVar6->ws + 8))->valid;
    bVar20 = false;
    if ((cVar11 == '\x01') && (uVar5 = 0, (peVar10->ws).sat.valid == '\x01')) {
      uVar5 = *(uint *)((long)&peVar10->ws + 4) + *(uint *)((long)&peVar6->ws + 0xc);
      goto LAB_00dc9aa0;
    }
LAB_00dc9aa3:
    if (bVar14 == 0) {
      uVar16 = (ulong)uVar5 << 0x20;
      uVar9 = (ulong)bVar20;
    }
    else if (bVar20) {
      if (uVar5 < uVar12) {
        uVar5 = uVar12;
      }
      uVar16 = (ulong)uVar5 << 0x20;
      uVar9 = 1;
    }
    else {
      uVar16 = (ulong)uVar12 << 0x20;
      uVar9 = (ulong)bVar14;
    }
    uVar16 = uVar16 | uVar9;
    uVar13 = 0;
LAB_00dc9c00:
    if ((cVar11 == '\0') || (((MaxInt<unsigned_int> *)((long)&peVar10->ws + 8))->valid != true)) {
      uVar19 = 0;
      uVar9 = 0;
    }
    else {
      uVar19 = (ulong)(*(uint *)((long)&peVar10->ws + 0xc) + *(uint *)((long)&peVar6->ws + 0xc)) <<
               0x20;
      uVar9 = 1;
    }
    MVar18 = (MaxInt<unsigned_int>)(uVar19 | uVar9);
    MVar7 = (MaxInt<unsigned_int>)(uVar16 | uVar13);
    break;
  case (MaxInt<unsigned_int>)0x18:
    local_78.valid = true;
    local_78 = (MaxInt<unsigned_int>)((ulong)local_78 & 0xffffffff);
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::reserve(&local_58,1);
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
    ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
              ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                *)&local_58,&local_78);
    psVar15 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar15 != psVar1) {
      do {
        if (((local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->valid == '\x01') &&
           (peVar6 = (psVar15->
                     super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr, (peVar6->ws).dsat.valid == true)) {
          uVar16 = (ulong)((peVar6->ws).dsat.value +
                          *(uint *)((long)local_58.
                                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4)) << 0x20;
          uVar9 = 1;
        }
        else {
          uVar16 = 0;
          uVar9 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar16 | uVar9);
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::reserve((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)&local_78,1);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        uVar16 = (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (8 < uVar16) {
          uVar9 = 1;
          do {
            peVar6 = (psVar15->
                     super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            uVar5 = 0;
            uVar12 = 0;
            bVar20 = false;
            if ((((MaxInt<unsigned_int> *)
                 ((long)local_58.
                        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar9 * 8))->valid == true) &&
               (uVar12 = 0, (peVar6->ws).dsat.valid == true)) {
              uVar12 = (peVar6->ws).dsat.value +
                       ((uint *)((long)local_58.
                                       super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4))[uVar9 * 2];
              bVar20 = true;
            }
            bVar2 = false;
            if ((((MaxInt<unsigned_int> *)
                 ((long)local_58.
                        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + -8))[uVar9].valid == true) &&
               (uVar5 = 0, (peVar6->ws).sat.valid == true)) {
              uVar5 = (peVar6->ws).sat.value +
                      ((uint *)((long)local_58.
                                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + -4))[uVar9 * 2];
              bVar2 = true;
            }
            if (bVar20) {
              if (bVar2) {
                if (uVar5 < uVar12) {
                  uVar5 = uVar12;
                }
                uVar16 = (ulong)uVar5 << 0x20;
                uVar13 = 1;
              }
              else {
                uVar16 = (ulong)uVar12 << 0x20;
                uVar13 = (ulong)bVar20;
              }
            }
            else {
              uVar16 = (ulong)uVar5 << 0x20;
              uVar13 = (ulong)bVar2;
            }
            local_80 = (MaxInt<unsigned_int>)(uVar16 | uVar13);
            std::
            vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
            ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                      ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                        *)&local_78,&local_80);
            uVar9 = uVar9 + 1;
            uVar16 = (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar9 < (ulong)((long)uVar16 >> 3));
        }
        if (((&((MaxInt<unsigned_int> *)
               ((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + -8))->valid)[uVar16] == true) &&
           (peVar6 = (psVar15->
                     super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr, (peVar6->ws).sat.valid == true)) {
          uVar9 = (ulong)((peVar6->ws).sat.value +
                         *(int *)((long)((long)local_58.
                                               super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + -4) +
                                 uVar16)) << 0x20;
          uVar16 = 1;
        }
        else {
          uVar9 = 0;
          uVar16 = 0;
        }
        local_80 = (MaxInt<unsigned_int>)(uVar9 | uVar16);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&local_78,&local_80);
        pMVar4 = local_58.
                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar3 = local_58.
                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pMStack_70;
        local_58.
        super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
        local_78.valid = false;
        local_78._1_3_ = 0;
        local_78.value = 0;
        pMStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        if (((MaxInt<unsigned_int>)pMVar3 != (MaxInt<unsigned_int>)0x0) &&
           (operator_delete(pMVar3,(long)pMVar4 - (long)pMVar3),
           local_78 != (MaxInt<unsigned_int>)0x0)) {
          operator_delete((void *)local_78,(long)local_68 - (long)local_78);
        }
        psVar15 = psVar15 + 1;
      } while (psVar15 != psVar1);
    }
    if ((ulong)((long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)this->k) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0x483,
                    "internal::WitnessSize miniscript::Node<unsigned int>::CalcWitnessSize() const [Key = unsigned int]"
                   );
    }
    MVar7 = *(MaxInt<unsigned_int> *)
             ((long)local_58.
                    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (ulong)this->k * 8);
    MVar18 = *local_58.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    operator_delete(local_58.
                    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    break;
  case (MaxInt<unsigned_int>)0x19:
    uVar5 = uVar5 * this->k + 1;
    lVar17 = (ulong)(this->k + 1) << 0x20;
    goto LAB_00dc9aff;
  case (MaxInt<unsigned_int>)0x1a:
    uVar16 = (long)(this->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (uVar5 - 1) * this->k + (int)(uVar16 >> 2);
    lVar17 = (uVar16 & 0xfffffffffffffffc) << 0x1e;
LAB_00dc9aff:
    MVar18 = (MaxInt<unsigned_int>)(lVar17 + 1);
LAB_00dc9b02:
    MVar7 = (MaxInt<unsigned_int>)(((ulong)uVar5 << 0x20) + 1);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                  ,0x487,
                  "internal::WitnessSize miniscript::Node<unsigned int>::CalcWitnessSize() const [Key = unsigned int]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  WVar21.dsat = MVar18;
  WVar21.sat = MVar7;
  return WVar21;
}

Assistant:

internal::WitnessSize CalcWitnessSize() const {
        const uint32_t sig_size = IsTapscript(m_script_ctx) ? 1 + 65 : 1 + 72;
        const uint32_t pubkey_size = IsTapscript(m_script_ctx) ? 1 + 32 : 1 + 33;
        switch (fragment) {
            case Fragment::JUST_0: return {{}, 0};
            case Fragment::JUST_1:
            case Fragment::OLDER:
            case Fragment::AFTER: return {0, {}};
            case Fragment::PK_K: return {sig_size, 1};
            case Fragment::PK_H: return {sig_size + pubkey_size, 1 + pubkey_size};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {1 + 32, {}};
            case Fragment::ANDOR: {
                const auto sat{(subs[0]->ws.sat + subs[1]->ws.sat) | (subs[0]->ws.dsat + subs[2]->ws.sat)};
                const auto dsat{subs[0]->ws.dsat + subs[2]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::AND_V: return {subs[0]->ws.sat + subs[1]->ws.sat, {}};
            case Fragment::AND_B: return {subs[0]->ws.sat + subs[1]->ws.sat, subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_B: {
                const auto sat{(subs[0]->ws.dsat + subs[1]->ws.sat) | (subs[0]->ws.sat + subs[1]->ws.dsat)};
                const auto dsat{subs[0]->ws.dsat + subs[1]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::OR_C: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), {}};
            case Fragment::OR_D: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_I: return {(subs[0]->ws.sat + 1 + 1) | (subs[1]->ws.sat + 1), (subs[0]->ws.dsat + 1 + 1) | (subs[1]->ws.dsat + 1)};
            case Fragment::MULTI: return {k * sig_size + 1, k + 1};
            case Fragment::MULTI_A: return {k * sig_size + static_cast<uint32_t>(keys.size()) - k, static_cast<uint32_t>(keys.size())};
            case Fragment::WRAP_A:
            case Fragment::WRAP_N:
            case Fragment::WRAP_S:
            case Fragment::WRAP_C: return subs[0]->ws;
            case Fragment::WRAP_D: return {1 + 1 + subs[0]->ws.sat, 1};
            case Fragment::WRAP_V: return {subs[0]->ws.sat, {}};
            case Fragment::WRAP_J: return {subs[0]->ws.sat, 1};
            case Fragment::THRESH: {
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    auto next_sats = Vector(sats[0] + sub->ws.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ws.dsat) | (sats[j - 1] + sub->ws.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ws.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {sats[k], sats[0]};
            }
        }
        assert(false);
    }